

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::allgather_big<unsigned_long>
               (unsigned_long *data,size_t size,unsigned_long *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  datatype local_48;
  datatype local_30;
  
  local_30._vptr_datatype = (_func_int **)&PTR__datatype_0014c1f0;
  local_30.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_30.builtin = true;
  datatype::contiguous(&local_48,&local_30,size);
  datatype::~datatype(&local_30);
  MPI_Allgather(data,1,local_48.mpitype,out,1,local_48.mpitype,comm->mpi_comm);
  datatype::~datatype(&local_48);
  return;
}

Assistant:

void allgather_big(const T* data, size_t size, T* out, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Allgather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), comm);
}